

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* license::filter_existing_files
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *fileList,EventRegistry *registry,char *extraData)

{
  LCC_EVENT_TYPE event;
  pointer __x;
  ifstream f;
  int aiStack_218 [122];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__x = (fileList->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      __x != (fileList->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    EventRegistry::addEvent(registry,LICENSE_SPECIFIED,(__x->_M_dataplus)._M_p,extraData);
    std::ifstream::ifstream(&f,(__x->_M_dataplus)._M_p,_S_in);
    event = IFF_UP;
    if (*(int *)((long)aiStack_218 + *(long *)(_f + -0x18)) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,__x);
      event = LICENSE_FOUND;
    }
    EventRegistry::addEvent(registry,event,(__x->_M_dataplus)._M_p,extraData);
    std::ifstream::close();
    std::ifstream::~ifstream(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> filter_existing_files(const vector<string> &fileList,
		EventRegistry& registry,const char* extraData) {
	vector<string> existingFiles;
	for (auto it = fileList.begin(); it != fileList.end(); it++) {
		registry.addEvent(LICENSE_SPECIFIED,it->c_str(), extraData);
		ifstream f(it->c_str());
		if (f.good()) {
			existingFiles.push_back(*it);
			registry.addEvent(LICENSE_FOUND,it->c_str(),extraData);
		} else {
			registry.addEvent(LICENSE_FILE_NOT_FOUND,it->c_str(), extraData);
		}
		f.close();
	}
	return existingFiles;
}